

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_avg_8x8_quad_avx2(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined4 *in_R8;
  undefined8 uVar4;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m128i hi;
  __m128i lo;
  __m256i rounding;
  __m256i u0;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i sum1;
  __m256i sum0;
  uint8_t *s_y1;
  uint8_t *s_y0;
  undefined4 local_6a0;
  undefined4 uStackY_698;
  undefined4 uStackY_688;
  void *in_stack_fffffffffffff980;
  void *in_stack_fffffffffffff988;
  undefined4 local_2e0;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar4 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar3._8_8_ = uVar10;
  auVar3._0_8_ = uVar4;
  auVar3._16_8_ = uVar11;
  auVar3._24_8_ = uVar12;
  auVar3 = vpsadbw_avx2(auVar3,ZEXT1632(ZEXT816(0)));
  auVar5 = auVar3;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar5 = vpsadbw_avx2(auVar5,ZEXT1632(ZEXT816(0)));
  auVar6 = auVar5;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar6 = vpsadbw_avx2(auVar6,ZEXT1632(ZEXT816(0)));
  auVar7 = auVar6;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar7 = vpsadbw_avx2(auVar7,ZEXT1632(ZEXT816(0)));
  auVar3 = vpaddw_avx2(auVar3,auVar5);
  auVar5 = vpaddw_avx2(auVar6,auVar7);
  auVar6 = auVar5;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar6 = vpsadbw_avx2(auVar6,ZEXT1632(ZEXT816(0)));
  auVar7 = auVar6;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar7 = vpsadbw_avx2(auVar7,ZEXT1632(ZEXT816(0)));
  auVar8 = auVar7;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar8 = vpsadbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
  auVar9 = auVar8;
  yy_loadu2_128(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  auVar9 = vpsadbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
  auVar6 = vpaddw_avx2(auVar6,auVar7);
  auVar3 = vpaddw_avx2(auVar3,auVar6);
  auVar6 = vpaddw_avx2(auVar8,auVar9);
  auVar5 = vpaddw_avx2(auVar5,auVar6);
  auVar3 = vpaddw_avx2(auVar3,auVar5);
  auVar1 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar1 = vpinsrd_avx(auVar1,0x20,2);
  auVar1 = vpinsrd_avx(auVar1,0x20,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar2 = vpinsrd_avx(auVar2,0x20,2);
  auVar2 = vpinsrd_avx(auVar2,0x20,3);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_68;
  auVar3 = vpaddd_avx2(auVar3,auVar5);
  auVar3 = vpsrld_avx2(auVar3,ZEXT416(6));
  local_2e0 = auVar3._16_4_;
  *in_R8 = local_2e0;
  uStackY_688 = auVar3._24_4_;
  in_R8[1] = uStackY_688;
  in_R8[2] = local_6a0;
  in_R8[3] = uStackY_698;
  return;
}

Assistant:

void aom_avg_8x8_quad_avx2(const uint8_t *s, int p, int x16_idx, int y16_idx,
                           int *avg) {
  const uint8_t *s_y0 = s + y16_idx * p + x16_idx;
  const uint8_t *s_y1 = s_y0 + 8 * p;
  __m256i sum0, sum1, s0, s1, s2, s3, u0;
  u0 = _mm256_setzero_si256();
  s0 = _mm256_sad_epu8(yy_loadu2_128(s_y1, s_y0), u0);
  s1 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + p, s_y0 + p), u0);
  s2 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 2 * p, s_y0 + 2 * p), u0);
  s3 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 3 * p, s_y0 + 3 * p), u0);
  sum0 = _mm256_add_epi16(s0, s1);
  sum1 = _mm256_add_epi16(s2, s3);
  s0 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 4 * p, s_y0 + 4 * p), u0);
  s1 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 5 * p, s_y0 + 5 * p), u0);
  s2 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 6 * p, s_y0 + 6 * p), u0);
  s3 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 7 * p, s_y0 + 7 * p), u0);
  sum0 = _mm256_add_epi16(sum0, _mm256_add_epi16(s0, s1));
  sum1 = _mm256_add_epi16(sum1, _mm256_add_epi16(s2, s3));
  sum0 = _mm256_add_epi16(sum0, sum1);

  // (avg + 32) >> 6
  __m256i rounding = _mm256_set1_epi32(32);
  sum0 = _mm256_add_epi32(sum0, rounding);
  sum0 = _mm256_srli_epi32(sum0, 6);
  __m128i lo = _mm256_castsi256_si128(sum0);
  __m128i hi = _mm256_extracti128_si256(sum0, 1);
  avg[0] = _mm_cvtsi128_si32(lo);
  avg[1] = _mm_extract_epi32(lo, 2);
  avg[2] = _mm_cvtsi128_si32(hi);
  avg[3] = _mm_extract_epi32(hi, 2);
}